

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

bool __thiscall
SkeletalMesh::Scene::setShaderInput
          (Scene *this,GLuint program,string *posiName,string *texcName,string *normName,
          string *bnidName,string *bnwtName)

{
  bool bVar1;
  GLuint GVar2;
  
  bVar1 = this->available;
  if (bVar1 == true) {
    (*__glewBindVertexArray)(this->vao);
    (*__glewBindBuffer)(0x8892,this->vbo);
    GVar2 = (*__glewGetAttribLocation)(program,(posiName->_M_dataplus)._M_p);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,3,0x1406,'\0',0x40,(void *)0x0);
    }
    GVar2 = (*__glewGetAttribLocation)(program,(texcName->_M_dataplus)._M_p);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,2,0x1406,'\0',0x40,(void *)0xc);
    }
    GVar2 = (*__glewGetAttribLocation)(program,(normName->_M_dataplus)._M_p);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,3,0x1406,'\0',0x40,(void *)0x14);
    }
    GVar2 = (*__glewGetAttribLocation)(program,(bnidName->_M_dataplus)._M_p);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribIPointer)(GVar2,4,0x1404,0x40,(void *)0x20);
    }
    GVar2 = (*__glewGetAttribLocation)(program,(bnwtName->_M_dataplus)._M_p);
    if (-1 < (int)GVar2) {
      (*__glewEnableVertexAttribArray)(GVar2);
      (*__glewVertexAttribPointer)(GVar2,4,0x1406,'\0',0x40,(void *)0x30);
    }
    (*__glewBindVertexArray)(0);
  }
  return bVar1;
}

Assistant:

bool setShaderInput(GLuint program,
                            std::string posiName, std::string texcName, std::string normName,
                            std::string bnidName, std::string bnwtName) {
            if (!available) return false;

            ParametricVertex example;

            glBindVertexArray(vao);
            glBindBuffer(GL_ARRAY_BUFFER, vbo);

            {
                GLint posiLoc = glGetAttribLocation(program, posiName.c_str());
                if (posiLoc >= 0) {
                    glEnableVertexAttribArray(posiLoc);
                    glVertexAttribPointer(posiLoc, 3, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.position - (char *) &example));
                }
            }
            {
                GLint texcLoc = glGetAttribLocation(program, texcName.c_str());
                if (texcLoc >= 0) {
                    glEnableVertexAttribArray(texcLoc);
                    glVertexAttribPointer(texcLoc, 2, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.texcoord - (char *) &example));
                }
            }
            {
                GLint normLoc = glGetAttribLocation(program, normName.c_str());
                if (normLoc >= 0) {
                    glEnableVertexAttribArray(normLoc);
                    glVertexAttribPointer(normLoc, 3, GL_FLOAT, GL_FALSE, sizeof(ParametricVertex),
                                          (const void *) ((char *) example.normal - (char *) &example));
                }
            }
            {
                GLint bnidLoc = glGetAttribLocation(program, bnidName.c_str());
                if (bnidLoc >= 0) {
                    glEnableVertexAttribArray(bnidLoc);
                    glVertexAttribIPointer(bnidLoc, SCENE_RESOURCE_BONE_PER_VERTEX, GL_INT, sizeof(ParametricVertex),
                                           (const void *) ((char *) example.boneId - (char *) &example));
                }
            }
            {
                GLint bnwtLoc = glGetAttribLocation(program, bnwtName.c_str());
                if (bnwtLoc >= 0) {
                    glEnableVertexAttribArray(bnwtLoc);
                    glVertexAttribPointer(bnwtLoc, SCENE_RESOURCE_BONE_PER_VERTEX, GL_FLOAT, GL_FALSE,
                                          sizeof(ParametricVertex),
                                          (const void *) ((char *) example.boneWeight - (char *) &example));
                }
            }

            glBindVertexArray(0);

            return true;
        }